

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::Executor(Executor *this,size_t N,shared_ptr<tf::WorkerInterface> *wix)

{
  bool bVar1;
  Executor *this_00;
  ulong in_RSI;
  long in_RDI;
  shared_ptr<tf::TFProfObserver> *observer;
  TFProfManager *this_01;
  char (*in_stack_000000a0) [41];
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
  *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  NonblockingNotifierV2 *in_stack_ffffffffffffff00;
  Executor *this_02;
  char *local_e8;
  allocator<char> local_79;
  string local_78 [64];
  ulong local_38;
  undefined8 local_10;
  undefined8 local_8;
  
  local_38 = in_RSI;
  std::mutex::mutex((mutex *)0x109cbc);
  std::allocator<tf::Worker>::allocator((allocator<tf::Worker> *)0x109cf5);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::vector
            ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(allocator_type *)in_stack_fffffffffffffee0);
  std::allocator<tf::Worker>::~allocator((allocator<tf::Worker> *)0x109d21);
  NonblockingNotifierV2::NonblockingNotifierV2(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x60));
  std::mutex::mutex((mutex *)0x109d6b);
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::list
            ((list<tf::Taskflow,_std::allocator<tf::Taskflow>_> *)0x109d8f);
  this_00 = (Executor *)(in_RDI + 0xd8);
  local_10 = local_38;
  local_8 = this_00;
  if (local_38 < 4) {
    local_e8 = (char *)0x1;
  }
  else {
    local_e8 = (char *)floor_log2<unsigned_long>(local_38);
  }
  this_02 = (Executor *)&stack0xffffffffffffffef;
  std::allocator<tf::Freelist<tf::Node_*>::Bucket>::allocator
            ((allocator<tf::Freelist<tf::Node_*>::Bucket> *)0x109e0d);
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  vector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::allocator<tf::Freelist<tf::Node_*>::Bucket>::~allocator
            ((allocator<tf::Freelist<tf::Node_*>::Bucket> *)0x109e6e);
  observer = (shared_ptr<tf::TFProfObserver> *)(in_RDI + 0xf0);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8)
  ;
  this_01 = (TFProfManager *)(in_RDI + 0x100);
  std::
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
                   *)0x109ea8);
  if (local_38 == 0) {
    throw_re<char_const(&)[41]>(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  }
  _spawn(this_02,(size_t)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,local_e8,
             (allocator<char> *)in_stack_ffffffffffffff00);
  bVar1 = has_env(in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar1) {
    TFProfManager::get();
    make_observer<tf::TFProfObserver>(this_00);
    TFProfManager::_manage(this_01,observer);
    std::shared_ptr<tf::TFProfObserver>::~shared_ptr((shared_ptr<tf::TFProfObserver> *)0x10a00a);
  }
  return;
}

Assistant:

inline Executor::Executor(size_t N, std::shared_ptr<WorkerInterface> wix) :
  _workers  (N),
  _notifier (N),
  _buffers  (N),
  _worker_interface(std::move(wix)) {

  if(N == 0) {
    TF_THROW("executor must define at least one worker");
  }

  _spawn(N);

  // initialize the default observer if requested
  if(has_env(TF_ENABLE_PROFILER)) {
    TFProfManager::get()._manage(make_observer<TFProfObserver>());
  }
}